

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall Analyser::analyse_scan_statement(Analyser *this)

{
  int iVar1;
  bool bVar2;
  string *psVar3;
  _Storage<Token,_false> local_138;
  optional<Token> next;
  string var;
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  nextToken(&next,this);
  if ((next.super__Optional_base<Token,_false,_false>._M_payload.
       super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
       _M_engaged != true) ||
     (next.super__Optional_base<Token,_false,_false>._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type != LEFT_BRACKET)) {
    psVar3 = (string *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              (local_40,"Missing \'(\'",(allocator<char> *)&local_138._M_value);
    iVar1 = this->_currentLine;
    std::__cxx11::string::string(psVar3,local_40);
    *(long *)(psVar3 + 0x20) = (long)iVar1;
    __cxa_throw(psVar3,&Error::typeinfo,Error::~Error);
  }
  nextToken((optional<Token> *)&local_138._M_value,this);
  std::_Optional_payload_base<Token>::_M_move_assign
            ((_Optional_payload_base<Token> *)&next,
             (_Optional_payload_base<Token> *)&local_138._M_value);
  std::_Optional_payload_base<Token>::_M_reset((_Optional_payload_base<Token> *)&local_138._M_value)
  ;
  if ((next.super__Optional_base<Token,_false,_false>._M_payload.
       super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
       _M_engaged == true) &&
     (next.super__Optional_base<Token,_false,_false>._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_payload._M_value._type == IDENTIFIER)) {
    std::any::any((any *)&local_138._M_value,
                  &next.super__Optional_base<Token,_false,_false>._M_payload.
                   super__Optional_payload<Token,_true,_false,_false>.
                   super__Optional_payload_base<Token>._M_payload._M_value._value);
    std::any_cast<std::__cxx11::string>(&var,(any *)&local_138._M_value);
    std::any::reset((any *)&local_138._M_value);
    bVar2 = loadVariable(this,&var);
    if (!bVar2) {
      psVar3 = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                (local_80,"the variable is not declared",(allocator<char> *)&local_138._M_value);
      iVar1 = this->_currentLine;
      std::__cxx11::string::string(psVar3,local_80);
      *(long *)(psVar3 + 0x20) = (long)iVar1;
      __cxa_throw(psVar3,&Error::typeinfo,Error::~Error);
    }
    local_138._0_8_ = 0x15;
    local_138._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    addInstruction(this,(Instruction *)&local_138._M_value);
    local_138._0_8_ = 0x17;
    local_138._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
    addInstruction(this,(Instruction *)&local_138._M_value);
    nextToken((optional<Token> *)&local_138._M_value,this);
    std::_Optional_payload_base<Token>::_M_move_assign
              ((_Optional_payload_base<Token> *)&next,
               (_Optional_payload_base<Token> *)&local_138._M_value);
    std::_Optional_payload_base<Token>::_M_reset
              ((_Optional_payload_base<Token> *)&local_138._M_value);
    if ((next.super__Optional_base<Token,_false,_false>._M_payload.
         super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
         _M_engaged == true) &&
       (next.super__Optional_base<Token,_false,_false>._M_payload.
        super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
        _M_payload._M_value._type == RIGHT_BRACKET)) {
      nextToken((optional<Token> *)&local_138._M_value,this);
      std::_Optional_payload_base<Token>::_M_move_assign
                ((_Optional_payload_base<Token> *)&next,
                 (_Optional_payload_base<Token> *)&local_138._M_value);
      std::_Optional_payload_base<Token>::_M_reset
                ((_Optional_payload_base<Token> *)&local_138._M_value);
      if ((next.super__Optional_base<Token,_false,_false>._M_payload.
           super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
           _M_engaged == true) &&
         (next.super__Optional_base<Token,_false,_false>._M_payload.
          super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
          _M_payload._M_value._type == SEMICOLON)) {
        std::__cxx11::string::~string((string *)&var);
        std::_Optional_payload_base<Token>::_M_reset((_Optional_payload_base<Token> *)&next);
        return;
      }
      psVar3 = (string *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string<std::allocator<char>>
                (local_c0,"Missing \';\'",(allocator<char> *)&local_138._M_value);
      iVar1 = this->_currentLine;
      std::__cxx11::string::string(psVar3,local_c0);
      *(long *)(psVar3 + 0x20) = (long)iVar1;
      __cxa_throw(psVar3,&Error::typeinfo,Error::~Error);
    }
    psVar3 = (string *)__cxa_allocate_exception(0x28);
    std::__cxx11::string::string<std::allocator<char>>
              (local_a0,"Missing \')\'",(allocator<char> *)&local_138._M_value);
    iVar1 = this->_currentLine;
    std::__cxx11::string::string(psVar3,local_a0);
    *(long *)(psVar3 + 0x20) = (long)iVar1;
    __cxa_throw(psVar3,&Error::typeinfo,Error::~Error);
  }
  psVar3 = (string *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"Missing identifier",(allocator<char> *)&local_138._M_value);
  iVar1 = this->_currentLine;
  std::__cxx11::string::string(psVar3,local_60);
  *(long *)(psVar3 + 0x20) = (long)iVar1;
  __cxa_throw(psVar3,&Error::typeinfo,Error::~Error);
}

Assistant:

void Analyser::analyse_scan_statement()
{
	auto next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::LEFT_BRACKET) {
		throw Error("Missing '('", _currentLine);
	}
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::IDENTIFIER) {
		throw Error("Missing identifier", _currentLine);
	}
	std::string var = std::any_cast<std::string>(next.value().GetValue());
	if (!loadVariable(var)) {
		throw Error("the variable is not declared", _currentLine);
	}
	addInstruction(Instruction(Operation::iscan));
	addInstruction(Instruction(Operation::istore));
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::RIGHT_BRACKET) {
		throw Error("Missing ')'", _currentLine);
	}
	next = nextToken();
	if (!next.has_value() || next.value().GetType() != TokenType::SEMICOLON) {
		throw Error("Missing ';'", _currentLine);
	}
}